

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.cpp
# Opt level: O0

void extract_cond_isotree
               (IsoForest *model,IsoTree *tree,string *cond_left,string *cond_right,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *numeric_colnames,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *categ_colnames,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *categ_levels)

{
  char cVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  runtime_error *this;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  int *in_RSI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_00000008;
  size_t categ;
  bool added_right;
  bool added_left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff738;
  char *in_stack_fffffffffffff750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff758;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff778;
  int __val;
  string local_6a0 [39];
  undefined1 local_679 [33];
  string local_658 [32];
  string local_638 [32];
  string local_618 [39];
  allocator<char> local_5f1;
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [39];
  allocator<char> local_569;
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [39];
  allocator<char> local_4e1;
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  ulong local_460;
  byte local_452;
  byte local_451;
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [38];
  byte local_32a;
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [38];
  byte local_282;
  allocator<char> local_281;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [38];
  byte local_1ba;
  allocator<char> local_1b9;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [38];
  byte local_112;
  allocator<char> local_111;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  int *local_10;
  long local_8;
  
  __val = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
             (allocator<char> *)in_stack_fffffffffffff760);
  std::__cxx11::string::operator=((string *)local_18,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
             (allocator<char> *)in_stack_fffffffffffff760);
  std::__cxx11::string::operator=(local_20,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  if (*(long *)(local_10 + 0xe) != 0) {
    if (*local_10 == 0x1f) {
      local_112 = 0;
      if (*(int *)(local_8 + 0x20) == 0x16) {
        if (*(double *)(local_10 + 0x12) < 0.5) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_28,*(size_type *)(local_10 + 2));
          std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_28,*(size_type *)(local_10 + 2));
          std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        }
      }
      else {
        std::allocator<char>::allocator();
        local_112 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                   (allocator<char> *)in_stack_fffffffffffff760);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_28,*(size_type *)(local_10 + 2));
      std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
      std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
      std::__cxx11::to_string((double)in_stack_fffffffffffff738);
      std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::__cxx11::string::operator=((string *)local_18,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      if ((local_112 & 1) != 0) {
        std::allocator<char>::~allocator(&local_111);
      }
      local_1ba = 0;
      if (*(int *)(local_8 + 0x20) == 0x16) {
        if (*(double *)(local_10 + 0x12) < 0.5) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_28,*(size_type *)(local_10 + 2));
          std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_28,*(size_type *)(local_10 + 2));
          std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        }
      }
      else {
        std::allocator<char>::allocator();
        local_1ba = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                   (allocator<char> *)in_stack_fffffffffffff760);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_28,*(size_type *)(local_10 + 2));
      std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
      std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
      std::__cxx11::to_string((double)in_stack_fffffffffffff738);
      std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      std::__cxx11::string::operator=(local_20,local_158);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      if ((local_1ba & 1) != 0) {
        std::allocator<char>::~allocator(&local_1b9);
      }
    }
    else {
      if (*local_10 != 0x20) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                   (allocator<char> *)in_stack_fffffffffffff760);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                   (allocator<char> *)in_stack_fffffffffffff760);
        std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                   (allocator<char> *)in_stack_fffffffffffff760);
        std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
        std::__cxx11::to_string(__val);
        std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                   (allocator<char> *)in_stack_fffffffffffff760);
        std::operator+(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
        std::runtime_error::runtime_error(this,local_6a0);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*(int *)(local_8 + 0x1c) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_30,*(size_type *)(local_10 + 2));
        std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        std::__cxx11::string::operator=((string *)local_18,local_350);
        std::__cxx11::string::~string(local_350);
        std::__cxx11::string::operator=(local_20,(string *)local_18);
        if (*(int *)(local_8 + 0x20) == 0x16) {
          if (*(double *)(local_10 + 0x12) < 0.5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
            std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
            std::__cxx11::string::operator=((string *)local_18,local_3f0);
            std::__cxx11::string::~string(local_3f0);
            std::__cxx11::string::~string(local_410);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
            std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
            std::__cxx11::string::operator=(local_20,local_430);
            std::__cxx11::string::~string(local_430);
            std::__cxx11::string::~string(local_450);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
            std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
            std::__cxx11::string::operator=((string *)local_18,local_370);
            std::__cxx11::string::~string(local_370);
            std::__cxx11::string::~string(local_390);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
            std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
            std::__cxx11::string::operator=(local_20,local_3b0);
            std::__cxx11::string::~string(local_3b0);
            std::__cxx11::string::~string(local_3d0);
          }
        }
        local_451 = 0;
        local_452 = 0;
        for (local_460 = 0; uVar2 = local_460,
            sVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                              ((vector<signed_char,_std::allocator<signed_char>_> *)(local_10 + 6)),
            uVar2 < sVar5; local_460 = local_460 + 1) {
          pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)(local_10 + 6),
                              local_460);
          pbVar3 = local_18;
          psVar7 = local_20;
          cVar1 = *pvVar6;
          if (cVar1 == -1) {
            if ((*(int *)(local_8 + 0x18) == 0xb) || (*(int *)(local_8 + 0x20) == 0x16)) {
              if (((*(int *)(local_8 + 0x18) == 0xb) &&
                  (*(double *)(local_10 + 0x12) <= 0.5 && *(double *)(local_10 + 0x12) != 0.5)) ||
                 ((*(int *)(local_8 + 0x20) == 0x16 && (0.5 <= *(double *)(local_10 + 0x12))))) {
                in_stack_fffffffffffff770 = local_18;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                           (allocator<char> *)in_stack_fffffffffffff760);
                std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
                pvVar4 = std::
                         vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator[](in_stack_00000008,*(size_type *)(local_10 + 2));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvVar4,local_460);
                std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
                std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
                std::__cxx11::string::append((string *)in_stack_fffffffffffff770);
                std::__cxx11::string::~string(local_590);
                std::__cxx11::string::~string(local_5b0);
                std::__cxx11::string::~string(local_5d0);
                std::__cxx11::string::~string(local_5f0);
                std::allocator<char>::~allocator(&local_5f1);
                local_451 = 1;
              }
              else {
                in_stack_fffffffffffff760 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6c58da;
                if ((local_452 & 1) != 0) {
                  in_stack_fffffffffffff760 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6c5ba1
                  ;
                }
                in_stack_fffffffffffff768 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_679;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                           (allocator<char> *)in_stack_fffffffffffff760);
                std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
                pvVar4 = std::
                         vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator[](in_stack_00000008,*(size_type *)(local_10 + 2));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvVar4,local_460);
                std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
                std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
                std::__cxx11::string::append(psVar7);
                std::__cxx11::string::~string(local_618);
                std::__cxx11::string::~string(local_638);
                std::__cxx11::string::~string(local_658);
                std::__cxx11::string::~string((string *)(local_679 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_679);
                local_452 = 1;
              }
            }
          }
          else if (cVar1 == '\0') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                       (allocator<char> *)in_stack_fffffffffffff760);
            std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
            pvVar4 = std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](in_stack_00000008,*(size_type *)(local_10 + 2));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](pvVar4,local_460);
            std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
            std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
            std::__cxx11::string::append(psVar7);
            std::__cxx11::string::~string(local_508);
            std::__cxx11::string::~string(local_528);
            std::__cxx11::string::~string(local_548);
            std::__cxx11::string::~string(local_568);
            std::allocator<char>::~allocator(&local_569);
            local_452 = 1;
          }
          else if (cVar1 == '\x01') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                       (allocator<char> *)in_stack_fffffffffffff760);
            std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
            pvVar4 = std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](in_stack_00000008,*(size_type *)(local_10 + 2));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](pvVar4,local_460);
            std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
            std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
            std::__cxx11::string::append((string *)pbVar3);
            std::__cxx11::string::~string(local_480);
            std::__cxx11::string::~string(local_4a0);
            std::__cxx11::string::~string(local_4c0);
            std::__cxx11::string::~string(local_4e0);
            std::allocator<char>::~allocator(&local_4e1);
            local_451 = 1;
          }
        }
        if ((local_451 & 1) == 0) {
          std::__cxx11::string::operator=((string *)local_18,"");
        }
        else {
          std::__cxx11::string::operator+=((string *)local_18,")");
        }
        if ((local_452 & 1) == 0) {
          std::__cxx11::string::operator=(local_20,"");
        }
        else {
          std::__cxx11::string::operator+=(local_20,")");
        }
      }
      else if (*(int *)(local_8 + 0x1c) == 0x29) {
        local_282 = 0;
        if (*(int *)(local_8 + 0x20) == 0x16) {
          if ((*(int *)(local_8 + 0x20) != 0x16) || (*(double *)(local_10 + 0x12) < 0.5)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
          }
        }
        else {
          std::allocator<char>::allocator();
          local_282 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                     (allocator<char> *)in_stack_fffffffffffff760);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_30,*(size_type *)(local_10 + 2));
        std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
        std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
        pvVar4 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](in_stack_00000008,*(size_type *)(local_10 + 2));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar4,(long)local_10[0xc]);
        std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
        std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
        std::__cxx11::string::operator=((string *)local_18,local_200);
        std::__cxx11::string::~string(local_200);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string(local_240);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_280);
        if ((local_282 & 1) != 0) {
          std::allocator<char>::~allocator(&local_281);
        }
        local_32a = 0;
        if (*(int *)(local_8 + 0x20) == 0x16) {
          if ((*(int *)(local_8 + 0x20) != 0x16) || (*(double *)(local_10 + 0x12) < 0.5)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_30,*(size_type *)(local_10 + 2));
            std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
          }
        }
        else {
          std::allocator<char>::allocator();
          local_32a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                     (allocator<char> *)in_stack_fffffffffffff760);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_30,*(size_type *)(local_10 + 2));
        std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
        std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
        pvVar4 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](in_stack_00000008,*(size_type *)(local_10 + 2));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar4,(long)local_10[0xc]);
        std::operator+(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
        std::operator+(in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730);
        std::__cxx11::string::operator=(local_20,local_2a8);
        std::__cxx11::string::~string(local_2a8);
        std::__cxx11::string::~string(local_2c8);
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_328);
        if ((local_32a & 1) != 0) {
          std::allocator<char>::~allocator(&local_329);
        }
      }
    }
  }
  return;
}

Assistant:

void extract_cond_isotree(const IsoForest &model, const IsoTree &tree,
                          std::string &cond_left, std::string &cond_right,
                          const std::vector<std::string> &numeric_colnames,
                          const std::vector<std::string> &categ_colnames,
                          const std::vector<std::vector<std::string>> &categ_levels)
{
    cond_left = std::string("");
    cond_right = std::string("");
    // if (tree.score >= 0.)
    if (tree.tree_left == 0)
        return;

    switch(tree.col_type)
    {
        case Numeric:
        {
            cond_left = ((model.missing_action != Impute)? "" :
                            ((tree.pct_tree_left >= .5)?
                                (numeric_colnames[tree.col_num]
                                    + " IS NULL OR ")
                                :
                                (numeric_colnames[tree.col_num]
                                    + " IS NOT NULL AND ")))
                            + numeric_colnames[tree.col_num]
                            + " <= "
                            + std::to_string(tree.num_split);
            cond_right = ((model.missing_action != Impute)? "" :
                            ((tree.pct_tree_left >= .5)?
                                (numeric_colnames[tree.col_num]
                                    + " IS NOT NULL AND ")
                                :
                                (numeric_colnames[tree.col_num]
                                    + " IS NULL OR ")))
                            + numeric_colnames[tree.col_num]
                            + " > "
                            + std::to_string(tree.num_split);
            break;
        }

        case Categorical:
        {
            switch(model.cat_split_type)
            {
                case SingleCateg:
                {
                    cond_left = ((model.missing_action != Impute)? "" :
                                    ((model.missing_action == Impute && tree.pct_tree_left >= .5)?
                                        (categ_colnames[tree.col_num]
                                            + " IS NULL OR ")
                                        :
                                        (categ_colnames[tree.col_num]
                                            + " IS NOT NULL AND ")))
                                    + categ_colnames[tree.col_num]
                                    + " = '"
                                    + categ_levels[tree.col_num][tree.chosen_cat]
                                    + "'";
                    cond_right = ((model.missing_action != Impute)? "" :
                                    ((model.missing_action == Impute && tree.pct_tree_left >= .5)?
                                        (categ_colnames[tree.col_num]
                                            + " IS NOT NULL AND ")
                                        :
                                        (categ_colnames[tree.col_num]
                                            + " IS NULL OR ")))
                                    + categ_colnames[tree.col_num]
                                    + " != '"
                                    + categ_levels[tree.col_num][tree.chosen_cat]
                                    + "'";
                    break;
                }

                case SubSet:
                {
                    cond_left = categ_colnames[tree.col_num] + " IN (";
                    cond_right = cond_left;
                    if (model.missing_action == Impute)
                    {
                        if (tree.pct_tree_left >= .5)
                        {
                            cond_left = categ_colnames[tree.col_num] + " IS NULL OR " + cond_left;
                            cond_right = categ_colnames[tree.col_num] + " IS NOT NULL AND " + cond_right;
                        }

                        else
                        {
                            cond_left = categ_colnames[tree.col_num] + " IS NOT NULL AND " + cond_left;
                            cond_right = categ_colnames[tree.col_num] + " IS NULL OR " + cond_right;
                        }
                    }
                    bool added_left = false;
                    bool added_right = false;
                    for (size_t categ = 0; categ < tree.cat_split.size(); categ++)
                    {
                        switch(tree.cat_split[categ])
                        {
                            case 1:
                            {
                                cond_left.append(
                                    std::string((added_left)? ", " : "")
                                    + "'"
                                    + categ_levels[tree.col_num][categ]
                                    + "'"
                                );
                                added_left = true;
                                break;
                            }

                            case 0:
                            {
                                cond_right.append(
                                    std::string((added_right)? ", " : "")
                                    + "'"
                                    + categ_levels[tree.col_num][categ]
                                    + "'"
                                );
                                added_right = true;
                                break;
                            }

                            case -1:
                            {
                                if (model.new_cat_action == Smallest || model.missing_action == Impute)
                                {
                                    if ((model.new_cat_action == Smallest && tree.pct_tree_left < .5) ||
                                        (model.missing_action == Impute && tree.pct_tree_left >= .5))
                                    {
                                        cond_left.append(
                                            std::string((added_left)? ", " : "")
                                            + "'"
                                            + categ_levels[tree.col_num][categ]
                                            + "'"
                                        );
                                        added_left = true;
                                    }
                                    else
                                    {
                                        cond_right.append(
                                            std::string((added_right)? ", " : "")
                                            + "'"
                                            + categ_levels[tree.col_num][categ]
                                            + "'"
                                        );
                                        added_right = true;
                                    }
                                }
                                break;
                            }
                        }
                    }
                    if (added_left)
                        cond_left += ")";
                    else
                        cond_left = "";
                    if (added_right)
                        cond_right += ")";
                    else
                        cond_right = "";

                    break;
                }
            }
            break;
        }

        default:
        {
            unexpected_error();
            break;
        }
    }
}